

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_arrow(runtime_type *this,var *a,token_base *b)

{
  char *__s1;
  int iVar1;
  undefined *puVar2;
  token_base *b_00;
  runtime_error *this_00;
  string local_40;
  
  if (b->_vptr_token_base == (_func_int **)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    puVar2 = (undefined *)(**(code **)(*(long *)b->_vptr_token_base[2] + 0x10))();
  }
  __s1 = *(char **)(puVar2 + 8);
  if (__s1 != "N2cs7pointerE") {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"N2cs7pointerE");
      if (iVar1 == 0) goto LAB_00135136;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unsupported operator operations(Arraw).","");
    runtime_error::runtime_error(this_00,&local_40);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
LAB_00135136:
  b_00 = (token_base *)cs_impl::any::const_val<cs::pointer>((any *)b);
  parse_dot(this,a,b_00);
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_arrow(const var &a, token_base *b)
	{
		if (a.type() == typeid(pointer))
			return parse_dot(a.const_val<pointer>().data, b);
		else
			throw runtime_error("Unsupported operator operations(Arraw).");
	}